

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

_func_void_char_ptr_size_t * __thiscall
Corrade::Utility::String::Implementation::(anonymous_namespace)::
uppercaseInPlaceImplementation(Corrade::Cpu::ScalarT)::$_0::operator_cast_to_function_pointer
          (__0 *this)

{
  anon_class_1_0_00000001 *this_local;
  
  return anon_unknown_12::uppercaseInPlaceImplementation::anon_class_1_0_00000001::__invoke;
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED typename std::decay<decltype(lowercaseInPlace)>::type uppercaseInPlaceImplementation(Cpu::ScalarT) {
  return [](char* data, const std::size_t size) {
    /* Same as above, except that (1 << 5) is subtracted for 'a' and all 26
       letters after. */
    const char* const end = data + size;
    for(char* c = data; c != end; ++c)
        *c -= (std::uint8_t(*c - 'a') < 26) << 5;
  };
}